

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTryCompileCommand.cxx
# Opt level: O3

void anon_unknown.dwarf_14c9205::WriteTryCompileEvent
               (cmConfigureLog *log,cmMakefile *mf,cmTryCompileResult *compileResult)

{
  bool bVar1;
  int iVar2;
  initializer_list<unsigned_long> __l;
  allocator_type local_41;
  string local_40;
  
  if ((anonymous_namespace)::
      WriteTryCompileEvent(cmConfigureLog&,cmMakefile_const&,cmTryCompileResult_const&)::
      LogVersionsWithTryCompileV1 == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 WriteTryCompileEvent(cmConfigureLog&,cmMakefile_const&,cmTryCompileResult_const&)
                                 ::LogVersionsWithTryCompileV1);
    if (iVar2 != 0) {
      local_40._M_dataplus._M_p = (pointer)0x1;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_40;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&WriteTryCompileEvent::LogVersionsWithTryCompileV1,__l,&local_41);
      __cxa_atexit(std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector,
                   &WriteTryCompileEvent::LogVersionsWithTryCompileV1,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           WriteTryCompileEvent(cmConfigureLog&,cmMakefile_const&,cmTryCompileResult_const&)
                           ::LogVersionsWithTryCompileV1);
    }
  }
  bVar1 = cmConfigureLog::IsAnyLogVersionEnabled
                    (log,&WriteTryCompileEvent::LogVersionsWithTryCompileV1);
  if (bVar1) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"try_compile-v1","");
    cmConfigureLog::BeginEvent(log,&local_40,mf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    cmCoreTryCompile::WriteTryCompileEventFields(log,compileResult);
    cmConfigureLog::EndEvent(log);
  }
  return;
}

Assistant:

void WriteTryCompileEvent(cmConfigureLog& log, cmMakefile const& mf,
                          cmTryCompileResult const& compileResult)
{
  // Keep in sync with cmFileAPIConfigureLog's DumpEventKindNames.
  static const std::vector<unsigned long> LogVersionsWithTryCompileV1{ 1 };

  if (log.IsAnyLogVersionEnabled(LogVersionsWithTryCompileV1)) {
    log.BeginEvent("try_compile-v1", mf);
    cmCoreTryCompile::WriteTryCompileEventFields(log, compileResult);
    log.EndEvent();
  }
}